

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
::merge_nodes(btree<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
              *this,node_type *left,node_type *right)

{
  bool bVar1;
  
  btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  ::merge(left,right,(allocator_type *)this);
  bVar1 = btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
          ::leaf(right);
  if (bVar1) {
    if (this->rightmost_ == right) {
      this->rightmost_ = left;
    }
    delete_leaf_node(this,right);
    return;
  }
  delete_internal_node(this,right);
  return;
}

Assistant:

void btree<P>::merge_nodes(node_type *left, node_type *right) {
        left->merge(right, mutable_allocator());
        if (right->leaf()) {
            if (rightmost_ == right) rightmost_ = left;
            delete_leaf_node(right);
        } else {
            delete_internal_node(right);
        }
    }